

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderParameterProbZ.cpp
# Opt level: O1

void __thiscall
OpenMD::OrderParameterProbZ::OrderParameterProbZ
          (OrderParameterProbZ *this,SimInfo *info,string *filename,string *sele,RealType dipoleX,
          RealType dipoleY,RealType dipoleZ,int nbins,int axis)

{
  SelectionEvaluator *this_00;
  string *psVar1;
  double dVar2;
  pointer pcVar3;
  pointer __s;
  pointer pdVar4;
  char *pcVar5;
  uint i;
  long *plVar6;
  pointer pOVar7;
  long lVar8;
  double dVar9;
  undefined1 local_98 [24];
  long lStack_80;
  SelectionManager *local_78;
  string *local_70;
  double local_68;
  double local_60;
  double local_58;
  string local_50;
  
  local_68 = dipoleX;
  local_60 = dipoleY;
  local_58 = dipoleZ;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__OrderParameterProbZ_0033cbb0;
  local_70 = &this->selectionScript_;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar3 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar3,pcVar3 + sele->_M_string_length);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_78 = &this->seleMan_;
  SelectionManager::SelectionManager(local_78,info);
  (this->thermo_).info_ = info;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->refAxis_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->refAxis_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->refAxis_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->dipoleVector_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->dipoleVector_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->dipoleVector_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->nbins_ = nbins;
  this->axis_ = axis;
  psVar1 = &this->axisLabel_;
  (this->axisLabel_)._M_dataplus._M_p = (pointer)&(this->axisLabel_).field_2;
  (this->axisLabel_)._M_string_length = 0;
  (this->axisLabel_).field_2._M_local_buf[0] = '\0';
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_98,this_00);
    lVar8 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar8),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_98._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_98);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->Count_,(long)nbins);
  __s = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar4 = (this->Count_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar4) {
    memset(__s,0,((long)pdVar4 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  pcVar5 = (char *)(this->axisLabel_)._M_string_length;
  if (this->axis_ == 1) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2d6956);
    (this->refAxis_).super_Vector<double,_3U>.data_[0] = 0.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[1] = 1.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[2] = 0.0;
  }
  else if (this->axis_ == 0) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2cea0f);
    (this->refAxis_).super_Vector<double,_3U>.data_[0] = 1.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[1] = 0.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[2] = 0.0;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,0x2c8dd7);
    (this->refAxis_).super_Vector<double,_3U>.data_[0] = 0.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[1] = 0.0;
    (this->refAxis_).super_Vector<double,_3U>.data_[2] = 1.0;
  }
  (this->dipoleVector_).super_Vector<double,_3U>.data_[0] = local_68;
  (this->dipoleVector_).super_Vector<double,_3U>.data_[1] = local_60;
  (this->dipoleVector_).super_Vector<double,_3U>.data_[2] = local_58;
  dVar9 = 0.0;
  lVar8 = 0;
  do {
    dVar2 = (this->dipoleVector_).super_Vector<double,_3U>.data_[lVar8];
    dVar9 = dVar9 + dVar2 * dVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  lVar8 = 0;
  do {
    (this->dipoleVector_).super_Vector<double,_3U>.data_[lVar8] =
         (this->dipoleVector_).super_Vector<double,_3U>.data_[lVar8] / dVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  getPrefix(&local_50,filename);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar7 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pOVar7) {
    local_98._16_8_ =
         (pOVar7->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_80 = plVar6[3];
    local_98._0_8_ = (pointer)(local_98 + 0x10);
  }
  else {
    local_98._16_8_ =
         (pOVar7->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_98._0_8_ = (pointer)*plVar6;
  }
  local_98._8_8_ = plVar6[1];
  *plVar6 = (long)pOVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_98._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

OrderParameterProbZ::OrderParameterProbZ(
      SimInfo* info, const std::string& filename, const std::string& sele,
      const RealType dipoleX, const RealType dipoleY, const RealType dipoleZ,
      int nbins, int axis) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      nbins_(nbins), axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins
    Count_.resize(nbins);
    std::fill(Count_.begin(), Count_.end(), 0);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      refAxis_   = Vector3d(1, 0, 0);
      break;
    case 1:
      axisLabel_ = "y";
      refAxis_   = Vector3d(0, 1, 0);
      break;
    case 2:
    default:
      axisLabel_ = "z";
      refAxis_   = Vector3d(0, 0, 1);
      break;
    }

    dipoleVector_ = Vector3d(dipoleX, dipoleY, dipoleZ);
    dipoleVector_.normalize();

    setOutputName(getPrefix(filename) + ".OrderProb");
  }